

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O3

void bloaty::wasm::ParseSymbols(RangeSink *sink)

{
  int iVar1;
  uint32_t uVar2;
  RangeSink *in_R8;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  dataseg_names;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  func_names;
  string_view local_f8;
  Section local_e8;
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  undefined1 local_68 [40];
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ = (pointer)0x1;
  local_68._16_8_ = (_Hash_node_base *)0x0;
  local_68._24_8_ = 0;
  local_68._32_4_ = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  local_f8._M_len = (sink->file_->data_)._M_len;
  local_f8._M_str = (sink->file_->data_)._M_str;
  ReadMagic(&local_f8);
  if (local_f8._M_len != 0) {
    do {
      Section::Read(&local_e8,&local_f8);
      iVar1 = std::__cxx11::string::compare((char *)&local_e8.name);
      if (iVar1 == 0) {
        ReadNames(&local_e8,(IndexedNames *)local_68,(IndexedNames *)&local_a0,sink);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.name._M_dataplus._M_p != &local_e8.name.field_2) {
        operator_delete(local_e8.name._M_dataplus._M_p,
                        local_e8.name.field_2._M_allocated_capacity + 1);
      }
    } while (local_f8._M_len != 0);
  }
  local_f8._M_len = (sink->file_->data_)._M_len;
  local_f8._M_str = (sink->file_->data_)._M_str;
  ReadMagic(&local_f8);
  if (local_f8._M_len != 0) {
    uVar2 = 0;
    do {
      Section::Read(&local_e8,&local_f8);
      if (local_e8.id == 0xb) {
        ReadDataSection(&local_e8,(IndexedNames *)&local_a0,sink);
      }
      else if (local_e8.id == 10) {
        ReadCodeSection((wasm *)&local_e8,(Section *)local_68,(IndexedNames *)(ulong)uVar2,
                        (uint32_t)sink,in_R8);
      }
      else if (local_e8.id == 2) {
        uVar2 = GetNumFunctionImports(&local_e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.name._M_dataplus._M_p != &local_e8.name.field_2) {
        operator_delete(local_e8.name._M_dataplus._M_p,
                        local_e8.name.field_2._M_allocated_capacity + 1);
      }
    } while (local_f8._M_len != 0);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_68);
  return;
}

Assistant:

void ParseSymbols(RangeSink* sink) {
  // First pass: read the custom naming section to get function names.
  std::unordered_map<int, std::string> func_names;
  std::unordered_map<int, std::string> dataseg_names;
  uint32_t num_imports = 0;

  ForEachSection(sink->input_file().data(),
                 [&func_names, &dataseg_names, sink](const Section& section) {
                   if (section.name == "name") {
                     ReadNames(section, &func_names, &dataseg_names, sink);
                   }
                 });

  // Second pass: read the function/code sections.
  ForEachSection(sink->input_file().data(),
                 [&func_names, &dataseg_names, &num_imports, sink](const Section& section) {
                   if (section.id == Section::kImport) {
                     num_imports = GetNumFunctionImports(section);
                   } else if (section.id == Section::kCode) {
                     ReadCodeSection(section, func_names, num_imports, sink);
                   } else if (section.id == Section::kData) {
                     ReadDataSection(section, dataseg_names, sink);
                   }
                 });
}